

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O0

Lookup * verona::resolve_fqtype(Lookup *__return_storage_ptr__,Node *fq)

{
  bool bVar1;
  NodeDef *this;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *node;
  element_type *this_00;
  Node *pNVar2;
  Token local_168;
  WFLookup local_160;
  shared_ptr<trieste::NodeDef> local_140;
  shared_ptr<trieste::NodeDef> local_130;
  Token local_120;
  Token local_118;
  Token local_110;
  Token local_108;
  initializer_list<trieste::Token> local_100;
  undefined4 local_ec;
  shared_ptr<trieste::NodeDef> local_e8;
  Token local_d8;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_d0;
  shared_ptr<trieste::NodeDef> *n;
  iterator __end1;
  iterator __begin1;
  NodeDef *__range1;
  undefined1 local_a8 [8];
  WFLookup path;
  Node local_78;
  undefined1 local_68 [8];
  Lookup p;
  Node *fq_local;
  
  trieste::Token::Token((Token *)&p.too_many_typeargs,(TokenDef *)FQType);
  bVar1 = trieste::operator==(fq,(Token *)&p.too_many_typeargs);
  if (!bVar1) {
    __assert_fail("fq == FQType",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                  ,0x11f,"Lookup verona::resolve_fqtype(Node)");
  }
  trieste::ast::top();
  Lookup::Lookup((Lookup *)local_68,&local_78);
  ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_78);
  trieste::Token::Token((Token *)&__range1,(TokenDef *)TypePath);
  trieste::operator/((WFLookup *)local_a8,fq,(Token *)&__range1);
  this = trieste::wf::detail::WFLookup::operator*((WFLookup *)local_a8);
  __end1 = trieste::NodeDef::begin(this);
  n = (shared_ptr<trieste::NodeDef> *)trieste::NodeDef::end(this);
  do {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                      (&__end1,(__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                                *)&n);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      trieste::Token::Token(&local_168,(TokenDef *)Type);
      trieste::operator/(&local_160,fq,&local_168);
      pNVar2 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_160);
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_140,pNVar2);
      bVar1 = resolve_typename((Lookup *)local_68,&local_140);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_140);
      trieste::wf::detail::WFLookup::~WFLookup(&local_160);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        Lookup::Lookup(__return_storage_ptr__,(Lookup *)local_68);
      }
      else {
        Lookup::Lookup(__return_storage_ptr__);
      }
LAB_001671e2:
      local_ec = 1;
      trieste::wf::detail::WFLookup::~WFLookup((WFLookup *)local_a8);
      Lookup::~Lookup((Lookup *)local_68);
      return __return_storage_ptr__;
    }
    node = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
           ::operator*(&__end1);
    local_d0 = node;
    trieste::Token::Token(&local_d8,(TokenDef *)Selector);
    bVar1 = trieste::operator==((Node *)node,&local_d8);
    if (bVar1) {
      ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                (&local_e8,(shared_ptr<trieste::NodeDef> *)local_d0);
      bVar1 = resolve_selector((Lookup *)local_68,&local_e8);
      ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_e8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        Lookup::Lookup(__return_storage_ptr__);
        goto LAB_001671e2;
      }
    }
    else {
      this_00 = ::std::
                __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(local_d0);
      trieste::Token::Token(&local_120,(TokenDef *)TypeClassName);
      trieste::Token::Token(&local_118,(TokenDef *)TypeAliasName);
      trieste::Token::Token(&local_110,(TokenDef *)TypeParamName);
      trieste::Token::Token(&local_108,(TokenDef *)TypeTraitName);
      local_100._M_array = &local_120;
      local_100._M_len = 4;
      bVar1 = trieste::NodeDef::in(this_00,&local_100);
      if (bVar1) {
        ::std::shared_ptr<trieste::NodeDef>::shared_ptr
                  (&local_130,(shared_ptr<trieste::NodeDef> *)local_d0);
        bVar1 = resolve_typename((Lookup *)local_68,&local_130);
        ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_130);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          Lookup::Lookup(__return_storage_ptr__);
          goto LAB_001671e2;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

static Lookup resolve_fqtype(Node fq)
  {
    assert(fq == FQType);
    Lookup p(ast::top());
    auto path = fq / TypePath;

    for (auto& n : *path)
    {
      if (n == Selector)
      {
        if (!resolve_selector(p, n))
          return {};
      }
      else if (n->in(
                 {TypeClassName, TypeAliasName, TypeParamName, TypeTraitName}))
      {
        if (!resolve_typename(p, n))
          return {};
      }
    }

    if (!resolve_typename(p, fq / Type))
      return {};

    return p;
  }